

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O2

void Aig_ManFanoutStart(Aig_Man_t *p)

{
  Aig_Obj_t *pFanout;
  uint __line;
  int *__s;
  char *__assertion;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  long lVar4;
  
  if (p->nObjs[4] == 0) {
    if (p->pFanData == (int *)0x0) {
      pVVar2 = p->vObjs;
      iVar1 = pVVar2->nSize;
      iVar3 = 0x1000;
      if (0x7ff < iVar1) {
        iVar3 = iVar1 * 2;
      }
      p->nFansAlloc = iVar3;
      __s = (int *)malloc((long)(iVar3 * 5) << 2);
      p->pFanData = __s;
      memset(__s,0,(long)iVar3 * 0x14);
      for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
        pFanout = (Aig_Obj_t *)pVVar2->pArray[lVar4];
        if (pFanout != (Aig_Obj_t *)0x0) {
          if (pFanout->pFanin0 != (Aig_Obj_t *)0x0) {
            Aig_ObjAddFanout(p,(Aig_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe),pFanout);
          }
          if (pFanout->pFanin1 != (Aig_Obj_t *)0x0) {
            Aig_ObjAddFanout(p,(Aig_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe),pFanout);
          }
        }
        pVVar2 = p->vObjs;
        iVar1 = pVVar2->nSize;
      }
      return;
    }
    __assertion = "p->pFanData == NULL";
    __line = 0x3e;
  }
  else {
    __assertion = "Aig_ManBufNum(p) == 0";
    __line = 0x3c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigFanout.c"
                ,__line,"void Aig_ManFanoutStart(Aig_Man_t *)");
}

Assistant:

void Aig_ManFanoutStart( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManBufNum(p) == 0 );
    // allocate fanout datastructure
    assert( p->pFanData == NULL );
    p->nFansAlloc = 2 * Aig_ManObjNumMax(p);
    if ( p->nFansAlloc < (1<<12) )
        p->nFansAlloc = (1<<12);
    p->pFanData = ABC_ALLOC( int, 5 * p->nFansAlloc );
    memset( p->pFanData, 0, sizeof(int) * 5 * p->nFansAlloc );
    // add fanouts for all objects
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjChild0(pObj) )
            Aig_ObjAddFanout( p, Aig_ObjFanin0(pObj), pObj );
        if ( Aig_ObjChild1(pObj) )
            Aig_ObjAddFanout( p, Aig_ObjFanin1(pObj), pObj );
    }
}